

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

int emit_string(nghttp2_bufs *bufs,uint8_t *str,size_t len)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  size_t n;
  ulong len_00;
  uint8_t sb [16];
  uint8_t local_48 [24];
  
  sVar3 = nghttp2_hd_huff_encode_count(str,len);
  n = len;
  if (sVar3 < len) {
    n = sVar3;
  }
  len_00 = 1;
  if (0x7e < n) {
    uVar4 = n - 0x7f;
    len_00 = 2;
    if (0x7f < uVar4) {
      do {
        len_00 = len_00 + 1;
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar4 >> 7;
      } while (bVar1);
    }
  }
  iVar2 = -0x20b;
  if (len_00 < 0x11) {
    local_48[0] = (sVar3 < len) << 7;
    encode_length(local_48,n,7);
    iVar2 = nghttp2_bufs_add(bufs,local_48,len_00);
    if (iVar2 == 0) {
      if (sVar3 < len) {
        iVar2 = nghttp2_hd_huff_encode(bufs,str,len);
      }
      else {
        iVar2 = nghttp2_bufs_add(bufs,str,len);
      }
    }
  }
  return iVar2;
}

Assistant:

static int emit_string(nghttp2_bufs *bufs, const uint8_t *str, size_t len) {
  int rv;
  uint8_t sb[16];
  uint8_t *bufp;
  size_t blocklen;
  size_t enclen;
  int huffman = 0;

  enclen = nghttp2_hd_huff_encode_count(str, len);

  if (enclen < len) {
    huffman = 1;
  } else {
    enclen = len;
  }

  blocklen = count_encoded_length(enclen, 7);

  DEBUGF("deflatehd: emit string str=%.*s, length=%zu, huffman=%d, "
         "encoded_length=%zu\n",
         (int)len, (const char *)str, len, huffman, enclen);

  if (sizeof(sb) < blocklen) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  bufp = sb;
  *bufp = huffman ? 1 << 7 : 0;
  encode_length(bufp, enclen, 7);

  rv = nghttp2_bufs_add(bufs, sb, blocklen);
  if (rv != 0) {
    return rv;
  }

  if (huffman) {
    rv = nghttp2_hd_huff_encode(bufs, str, len);
  } else {
    assert(enclen == len);
    rv = nghttp2_bufs_add(bufs, str, len);
  }

  return rv;
}